

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_suppression_impl.cc
# Opt level: O0

void __thiscall
webrtc::NoiseSuppressionImpl::Suppressor::Suppressor(Suppressor *this,int sample_rate_hz)

{
  NsHandle *pNVar1;
  ostream *poVar2;
  FatalMessage local_328;
  string *local_1b0;
  string *_result;
  int error;
  byte local_191;
  FatalMessage local_190;
  FatalMessageVoidify local_15;
  uint32_t local_14;
  Suppressor *pSStack_10;
  int sample_rate_hz_local;
  Suppressor *this_local;
  
  this->state_ = (NsState *)0x0;
  local_14 = sample_rate_hz;
  pSStack_10 = this;
  pNVar1 = WebRtcNs_Create();
  this->state_ = pNVar1;
  local_191 = 0;
  if (this->state_ == (NsState *)0x0) {
    rtc::FatalMessageVoidify::FatalMessageVoidify(&local_15);
    rtc::FatalMessage::FatalMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/noise_suppression_impl.cc"
               ,0x23);
    local_191 = 1;
    poVar2 = rtc::FatalMessage::stream(&local_190);
    poVar2 = std::operator<<(poVar2,"Check failed: state_");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"# ");
    rtc::FatalMessageVoidify::operator&(&local_15,poVar2);
  }
  if ((local_191 & 1) != 0) {
    rtc::FatalMessage::~FatalMessage(&local_190);
  }
  _result._0_4_ = WebRtcNs_Init(this->state_,local_14);
  local_1b0 = rtc::CheckEQImpl_abi_cxx11_(0,(int)_result,"0 == error");
  if (local_1b0 == (string *)0x0) {
    return;
  }
  rtc::FatalMessage::FatalMessage
            (&local_328,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/noise_suppression_impl.cc"
             ,0x25,local_1b0);
  rtc::FatalMessage::stream(&local_328);
  rtc::FatalMessage::~FatalMessage(&local_328);
}

Assistant:

explicit Suppressor(int sample_rate_hz) {
    state_ = NS_CREATE();
    RTC_CHECK(state_);
    int error = NS_INIT(state_, sample_rate_hz);
    RTC_DCHECK_EQ(0, error);
  }